

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvParseLineLtlProperty(Io_MvMod_t *p,char *pLine)

{
  int iVar1;
  size_t sVar2;
  void *Entry;
  char *actualLtlFormula;
  char keyWordLtlFormula [11];
  int quoteEnd;
  int quoteBegin;
  int j;
  int i;
  char *pLine_local;
  Io_MvMod_t *p_local;
  
  for (quoteBegin = 0; quoteBegin < 10; quoteBegin = quoteBegin + 1) {
    *(char *)((long)&actualLtlFormula + (long)quoteBegin + 5) = pLine[quoteBegin];
  }
  keyWordLtlFormula[7] = (undefined1)quoteBegin;
  keyWordLtlFormula[8] = quoteBegin._1_1_;
  keyWordLtlFormula[9] = quoteBegin._2_1_;
  keyWordLtlFormula[10] = quoteBegin._3_1_;
  keyWordLtlFormula[2] = '\0';
  iVar1 = strcmp("ltlformula",(char *)((long)&actualLtlFormula + 5));
  if (iVar1 != 0) {
    __assert_fail("strcmp( \"ltlformula\", keyWordLtlFormula ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadBlifMv.c"
                  ,0x497,"int Io_MvParseLineLtlProperty(Io_MvMod_t *, char *)");
  }
  for (; pLine[quoteBegin] != '\"'; quoteBegin = quoteBegin + 1) {
  }
  keyWordLtlFormula[7] = (undefined1)quoteBegin;
  keyWordLtlFormula[8] = quoteBegin._1_1_;
  keyWordLtlFormula[9] = quoteBegin._2_1_;
  keyWordLtlFormula[10] = quoteBegin._3_1_;
  sVar2 = strlen(pLine);
  for (quoteBegin = (int)sVar2; pLine[quoteBegin] != '\"'; quoteBegin = quoteBegin + -1) {
  }
  keyWordLtlFormula[3] = (undefined1)quoteBegin;
  keyWordLtlFormula[4] = quoteBegin._1_1_;
  keyWordLtlFormula[5] = quoteBegin._2_1_;
  keyWordLtlFormula[6] = quoteBegin._3_1_;
  Entry = malloc((long)(quoteBegin - keyWordLtlFormula._7_4_));
  quoteEnd = 0;
  quoteBegin = keyWordLtlFormula._7_4_;
  while (quoteBegin = quoteBegin + 1, quoteBegin < (int)keyWordLtlFormula._3_4_) {
    *(char *)((long)Entry + (long)quoteEnd) = pLine[quoteBegin];
    quoteEnd = quoteEnd + 1;
  }
  *(undefined1 *)((long)Entry + (long)quoteEnd) = 0;
  Vec_PtrPush(vGlobalLtlArray,Entry);
  return 1;
}

Assistant:

static int Io_MvParseLineLtlProperty( Io_MvMod_t * p, char * pLine )
{
    int i, j;
    int quoteBegin, quoteEnd;
    char keyWordLtlFormula[11];
    char *actualLtlFormula;

    //checking if the line begins with the keyword "ltlformula" and
    //progressing the pointer forword
    for( i=0; i<10; i++ )
        keyWordLtlFormula[i] = pLine[i];
    quoteBegin = i;
    keyWordLtlFormula[10] = '\0';
    assert( strcmp( "ltlformula", keyWordLtlFormula ) == 0 );
    while( pLine[i] != '"' )
        i++;
    quoteBegin = i;
    i = strlen( pLine );
    while( pLine[i] != '"' )
        i--;
    quoteEnd = i;
    actualLtlFormula = (char *)malloc( sizeof(char) * (quoteEnd - quoteBegin) );
    //printf("\nThe input ltl formula = ");
    for( i = quoteBegin + 1, j = 0; i<quoteEnd; i++, j++ )
        //printf("%c", pLine[i] );
        actualLtlFormula[j] = pLine[i];
    actualLtlFormula[j] = '\0';
    Vec_PtrPush( vGlobalLtlArray, actualLtlFormula );
    return 1;
}